

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglplatformcontext.cpp
# Opt level: O0

void __thiscall
QEGLPlatformContext::swapBuffers(QEGLPlatformContext *this,QPlatformSurface *surface)

{
  int iVar1;
  uint uVar2;
  QMessageLogger *this_00;
  undefined8 in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  bool ok;
  EGLSurface eglSurface;
  char *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb8;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  eglBindAPI((int)in_RDI[8]);
  this_00 = (QMessageLogger *)(**(code **)(*in_RDI + 0x88))(in_RDI,in_RSI);
  if (this_00 != (QMessageLogger *)0x0) {
    iVar1 = eglSwapBuffers(in_RDI[5],this_00);
    if (iVar1 == 0) {
      QMessageLogger::QMessageLogger
                (this_00,(char *)CONCAT17(iVar1 != 0,in_stack_ffffffffffffffb8),
                 (int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffa8);
      uVar2 = eglGetError();
      QMessageLogger::warning
                (local_28,"QEGLPlatformContext: eglSwapBuffers failed: %x",(ulong)uVar2);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QEGLPlatformContext::swapBuffers(QPlatformSurface *surface)
{
    eglBindAPI(m_api);
    EGLSurface eglSurface = eglSurfaceForPlatformSurface(surface);
    if (eglSurface != EGL_NO_SURFACE) { // skip if using surfaceless context
        bool ok = eglSwapBuffers(m_eglDisplay, eglSurface);
        if (!ok)
            qWarning("QEGLPlatformContext: eglSwapBuffers failed: %x", eglGetError());
    }
}